

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealLPAndRecordStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Settings *pSVar6;
  Tolerances *pTVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  Statistics *pSVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  Verbosity old_verbosity;
  Representation p_rep;
  Type tp;
  bool bVar14;
  double extraout_XMM0_Qa;
  Real RVar15;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined5 uStack_150;
  undefined3 uStack_14b;
  undefined5 local_148;
  undefined3 uStack_143;
  int local_140;
  bool local_13c;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined5 uStack_110;
  undefined3 uStack_10b;
  undefined5 local_108;
  undefined3 uStack_103;
  int local_100;
  bool local_fc;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined5 uStack_d0;
  undefined3 uStack_cb;
  undefined5 local_c8;
  undefined3 uStack_c3;
  int local_c0;
  bool local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 local_88;
  undefined3 uStack_83;
  int local_80;
  bool local_7c;
  undefined8 local_78;
  undefined8 local_68;
  uint auStack_60 [5];
  undefined3 uStack_4b;
  uint local_48;
  undefined3 uStack_43;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  pSVar6 = this->_currentSettings;
  dVar16 = pSVar6->_realParamValues[6];
  iVar12 = -1;
  if ((double)pSVar6->_intParamValues[5] < dVar16) {
    iVar13 = pSVar6->_intParamValues[5] - this->_statistics->iterations;
    iVar12 = -1;
    if (-1 < iVar13) {
      iVar12 = iVar13;
    }
  }
  bVar14 = this->_hasBasis;
  (this->_solver).maxIters = iVar12;
  dVar1 = pSVar6->_realParamValues[7];
  if (dVar1 < dVar16) {
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    dVar16 = dVar1 - extraout_XMM0_Qa;
  }
  RVar15 = 0.0;
  if (0.0 <= dVar16) {
    RVar15 = dVar16;
  }
  (this->_solver).maxTime = RVar15;
  RVar15 = Tolerances::epsilon((this->_solver).
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  local_38._0_4_ = cpp_dec_float_finite;
  local_38._4_4_ = 10;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  auStack_60[0] = 0;
  auStack_60[1] = 0;
  auStack_60[2] = 0;
  auStack_60[3] = 0;
  stack0xffffffffffffffb0 = 0;
  uStack_4b = 0;
  _local_48 = 0;
  uStack_43 = 0;
  local_40 = 0;
  local_3c = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,RVar15);
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems._24_5_ = 0;
  local_1e8.data._M_elems[7]._1_3_ = 0;
  local_1e8.data._M_elems._32_5_ = 0;
  local_1e8.data._M_elems[9]._1_3_ = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  local_1a8.fpclass = cpp_dec_float_finite;
  local_1a8.prec_elem = 10;
  local_1a8.data._M_elems[0] = 0;
  local_1a8.data._M_elems[1] = 0;
  local_1a8.data._M_elems[2] = 0;
  local_1a8.data._M_elems[3] = 0;
  local_1a8.data._M_elems[4] = 0;
  local_1a8.data._M_elems[5] = 0;
  local_1a8.data._M_elems._24_5_ = 0;
  local_1a8.data._M_elems[7]._1_3_ = 0;
  local_1a8.data._M_elems._32_5_ = 0;
  local_1a8.data._M_elems[9]._1_3_ = 0;
  local_1a8.exp = 0;
  local_1a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_1a8,10000.0);
  local_1e8.data._M_elems[0] = (uint)local_68;
  local_1e8.data._M_elems[1] = local_68._4_4_;
  local_1e8.data._M_elems[2] = auStack_60[0];
  local_1e8.data._M_elems[3] = auStack_60[1];
  local_1e8.data._M_elems[4] = auStack_60[2];
  local_1e8.data._M_elems[5] = auStack_60[3];
  local_1e8.data._M_elems._24_5_ = stack0xffffffffffffffb0;
  local_1e8.data._M_elems[7]._1_3_ = uStack_4b;
  local_1e8.data._M_elems._32_5_ = _local_48;
  local_1e8.data._M_elems[9]._1_3_ = uStack_43;
  local_1e8.exp = local_40;
  local_1e8.neg = (bool)local_3c;
  local_1e8.fpclass = (fpclass_type)local_38;
  local_1e8.prec_elem = local_38._4_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_1e8,&local_1a8);
  pTVar7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  RVar15 = Tolerances::floatingPointFeastol(pTVar7);
  bVar11 = false;
  if ((!NAN(RVar15)) && (local_1e8.fpclass != cpp_dec_float_NaN)) {
    local_1a8.fpclass = cpp_dec_float_finite;
    local_1a8.prec_elem = 10;
    local_1a8.data._M_elems[0] = 0;
    local_1a8.data._M_elems[1] = 0;
    local_1a8.data._M_elems[2] = 0;
    local_1a8.data._M_elems[3] = 0;
    local_1a8.data._M_elems[4] = 0;
    local_1a8.data._M_elems[5] = 0;
    local_1a8.data._M_elems._24_5_ = 0;
    local_1a8.data._M_elems[7]._1_3_ = 0;
    local_1a8.data._M_elems._32_5_ = 0;
    local_1a8.data._M_elems[9]._1_3_ = 0;
    local_1a8.exp = 0;
    local_1a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1a8,RVar15);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_1e8,&local_1a8);
    bVar11 = 0 < iVar12;
  }
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  if (bVar11) {
    pTVar7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    dVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                       (&local_1e8);
    Tolerances::setFloatingPointFeastol(pTVar7,dVar16);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
  }
  pTVar7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  RVar15 = Tolerances::floatingPointOpttol(pTVar7);
  bVar11 = false;
  if ((!NAN(RVar15)) && (bVar11 = false, local_1e8.fpclass != cpp_dec_float_NaN)) {
    local_1a8.fpclass = cpp_dec_float_finite;
    local_1a8.prec_elem = 10;
    local_1a8.data._M_elems[0] = 0;
    local_1a8.data._M_elems[1] = 0;
    local_1a8.data._M_elems[2] = 0;
    local_1a8.data._M_elems[3] = 0;
    local_1a8.data._M_elems[4] = 0;
    local_1a8.data._M_elems[5] = 0;
    local_1a8.data._M_elems._24_5_ = 0;
    local_1a8.data._M_elems[7]._1_3_ = 0;
    local_1a8.data._M_elems._32_5_ = 0;
    local_1a8.data._M_elems[9]._1_3_ = 0;
    local_1a8.exp = 0;
    local_1a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1a8,RVar15);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_1e8,&local_1a8);
    bVar11 = 0 < iVar12;
  }
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  if (bVar11) {
    pTVar7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    dVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                       (&local_1e8);
    Tolerances::setFloatingPointOpttol(pTVar7,dVar16);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
  }
  this_00 = &this->_solver;
  pSVar6 = this->_currentSettings;
  iVar12 = pSVar6->_intParamValues[1];
  if (iVar12 == 2) {
LAB_0034f99d:
    p_rep = ROW;
    if ((this->_solver).theRep == ROW) goto LAB_0034f9b3;
  }
  else {
    if (iVar12 != 1) {
      if (iVar12 != 0) goto LAB_0034f9b3;
      if ((double)((this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum + 1) <=
          (double)((this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum + 1) * pSVar6->_realParamValues[0x10]) goto LAB_0034f95a;
LAB_0034f968:
      if ((iVar12 != 2) &&
         ((iVar12 != 0 ||
          ((double)((this->_solver).
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum + 1) <=
           (double)((this->_solver).
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum + 1) * pSVar6->_realParamValues[0x10])))) goto LAB_0034f9b3;
      goto LAB_0034f99d;
    }
LAB_0034f95a:
    p_rep = COLUMN;
    if ((this->_solver).theRep == COLUMN) goto LAB_0034f968;
  }
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::initRep(this_00,p_rep);
LAB_0034f9b3:
  iVar12 = this->_currentSettings->_intParamValues[2];
  if (((((iVar12 == 0) && ((this->_solver).theRep == COLUMN)) ||
       ((iVar12 == 1 && ((this->_solver).theRep == ROW)))) &&
      (tp = ENTER, (this->_solver).theType != ENTER)) ||
     ((((iVar12 == 1 && ((this->_solver).theRep == COLUMN)) ||
       ((iVar12 == 0 && ((this->_solver).theRep == ROW)))) &&
      (tp = LEAVE, (this->_solver).theType != LEAVE)))) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setType(this_00,tp);
  }
  local_78 = 0xa00000000;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  uStack_8b = 0;
  local_88 = 0;
  uStack_83 = 0;
  local_80 = 0;
  local_7c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,this->_currentSettings->_realParamValues[0xf])
  ;
  *(undefined8 *)(this->_solver).sparsePricingFactor.m_backend.data._M_elems = local_a8;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 2) = uStack_a0;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 4) = local_98;
  *(ulong *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_8b,uStack_90);
  *(ulong *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_83,local_88);
  (this->_solver).sparsePricingFactor.m_backend.exp = local_80;
  (this->_solver).sparsePricingFactor.m_backend.neg = local_7c;
  (this->_solver).sparsePricingFactor.m_backend.fpclass = (undefined4)local_78;
  (this->_solver).sparsePricingFactor.m_backend.prec_elem = local_78._4_4_;
  iVar12 = this->_currentSettings->_intParamValues[0x14];
  if (iVar12 == 0) {
    (this->_solver).hyperPricingLeave = false;
    (this->_solver).hyperPricingEnter = false;
  }
  else if ((iVar12 == 2) ||
          ((iVar12 == 1 &&
           (5000 < (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum +
                   (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum)))) {
    (this->_solver).hyperPricingLeave = true;
    (this->_solver).hyperPricingEnter = true;
    DIdxSet::setMax(&(this->_solver).updateViols,(((this->_solver).thecovectors)->set).thenum);
    DIdxSet::setMax(&(this->_solver).updateViolsCo,(((this->_solver).thevectors)->set).thenum);
  }
  local_b8 = 0xa00000000;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  uStack_cb = 0;
  local_c8 = 0;
  uStack_c3 = 0;
  local_c0 = 0;
  local_bc = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_e8,this->_currentSettings->_realParamValues[0x13]
            );
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .nonzeroFactor.m_backend.data._M_elems = local_e8;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 2) = uStack_e0;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 4) = local_d8;
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .nonzeroFactor.m_backend.data._M_elems + 6) = CONCAT35(uStack_cb,uStack_d0);
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .nonzeroFactor.m_backend.data._M_elems + 8) = CONCAT35(uStack_c3,local_c8);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.exp = local_c0;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.neg = local_bc;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.fpclass = (undefined4)local_b8;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.prec_elem = local_b8._4_4_;
  local_f8 = 0xa00000000;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_10b = 0;
  local_108 = 0;
  uStack_103 = 0;
  local_100 = 0;
  local_fc = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_128,
             this->_currentSettings->_realParamValues[0x14]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .fillFactor.m_backend.data._M_elems = local_128;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 2) = uStack_120;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 4) = local_118;
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .fillFactor.m_backend.data._M_elems + 6) = CONCAT35(uStack_10b,uStack_110);
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .fillFactor.m_backend.data._M_elems + 8) = CONCAT35(uStack_103,local_108);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.exp = local_100;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.neg = local_fc;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.fpclass = (undefined4)local_f8;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.prec_elem = local_f8._4_4_;
  local_138 = 0xa00000000;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  uStack_14b = 0;
  local_148 = 0;
  uStack_143 = 0;
  local_140 = 0;
  local_13c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_168,
             this->_currentSettings->_realParamValues[0x15]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .memFactor.m_backend.data._M_elems = local_168;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 2) = uStack_160;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 4) = local_158;
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memFactor.m_backend.data._M_elems + 6) = CONCAT35(uStack_14b,uStack_150);
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memFactor.m_backend.data._M_elems + 8) = CONCAT35(uStack_143,local_148);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.exp = local_140;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.neg = local_13c;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.fpclass = (undefined4)local_138;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.prec_elem = local_138._4_4_;
  (*this->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(this_00,interrupt,true);
  (*this->_statistics->simplexTime->_vptr_Timer[4])();
  if ((0 < (this->_solver).
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .iterCount) && ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED)) {
    SLUFactorRational::init(&this->_rationalLUSolver,(EVP_PKEY_CTX *)interrupt);
  }
  iVar12 = (this->_solver).
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .iterCount;
  pSVar9 = this->_statistics;
  pSVar9->iterations = pSVar9->iterations + iVar12;
  iVar13 = iVar12;
  if (iVar12 != 0) {
    iVar13 = (this->_solver).primalCount;
  }
  pSVar9->iterationsPrimal = pSVar9->iterationsPrimal + iVar13;
  iVar13 = 0;
  if (bVar14 != false) {
    iVar13 = iVar12;
  }
  pSVar9->iterationsFromBasis = pSVar9->iterationsFromBasis + iVar13;
  pSVar9->iterationsPolish = pSVar9->iterationsPolish + (this->_solver).polishCount;
  pSVar9->boundflips = pSVar9->boundflips + (this->_solver).totalboundflips;
  (*((this->_solver).multTimeSparse)->_vptr_Timer[6])();
  this->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + this->_statistics->multTimeSparse;
  (*((this->_solver).multTimeFull)->_vptr_Timer[6])();
  this->_statistics->multTimeFull = extraout_XMM0_Qa_01 + this->_statistics->multTimeFull;
  (*((this->_solver).multTimeColwise)->_vptr_Timer[6])();
  this->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + this->_statistics->multTimeColwise;
  (*((this->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  pSVar9 = this->_statistics;
  pSVar9->multTimeUnsetup = extraout_XMM0_Qa_03 + pSVar9->multTimeUnsetup;
  uVar2 = (this->_solver).multSparseCalls;
  uVar3 = (this->_solver).multFullCalls;
  uVar4 = (this->_solver).multColwiseCalls;
  uVar5 = (this->_solver).multUnsetupCalls;
  pSVar9->multSparseCalls = pSVar9->multSparseCalls + uVar2;
  pSVar9->multFullCalls = pSVar9->multFullCalls + uVar3;
  pSVar9->multColwiseCalls = pSVar9->multColwiseCalls + uVar4;
  pSVar9->multUnsetupCalls = pSVar9->multUnsetupCalls + uVar5;
  (*((this->_slufactor).
     super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .factorTime)->_vptr_Timer[6])();
  this->_statistics->luFactorizationTimeReal =
       extraout_XMM0_Qa_04 + this->_statistics->luFactorizationTimeReal;
  (*((this->_slufactor).solveTime)->_vptr_Timer[6])();
  pSVar9 = this->_statistics;
  pSVar9->luSolveTimeReal = extraout_XMM0_Qa_05 + pSVar9->luSolveTimeReal;
  pSVar9->luFactorizationsReal =
       pSVar9->luFactorizationsReal +
       (this->_slufactor).
       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .factorCount;
  pSVar9->luSolvesReal = pSVar9->luSolvesReal + (this->_slufactor).solveCount;
  (*((this->_slufactor).
     super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .factorTime)->_vptr_Timer[2])();
  (*((this->_slufactor).solveTime)->_vptr_Timer[2])();
  (this->_slufactor).
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .factorCount = 0;
  (this->_slufactor).
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .hugeValues = 0;
  (this->_slufactor).solveCount = 0;
  bVar14 = (this->_solver).theRep == ROW;
  pSVar9 = this->_statistics;
  pSVar9->degenPivotsPrimal =
       pSVar9->degenPivotsPrimal +
       (this->_solver).primalDegenSum.m_backend.data._M_elems[(ulong)bVar14 - 4];
  pSVar9->degenPivotsDual =
       pSVar9->degenPivotsDual +
       (this->_solver).primalDegenSum.m_backend.data._M_elems[(ulong)!bVar14 - 4];
  uVar10 = *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 8);
  local_1a8.data._M_elems._32_5_ = SUB85(uVar10,0);
  local_1a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_1a8.data._M_elems._0_8_ =
       *(undefined8 *)(this->_solver).dualDegenSum.m_backend.data._M_elems;
  local_1a8.data._M_elems._8_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 2);
  local_1a8.data._M_elems._16_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 4);
  uVar10 = *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 6);
  local_1a8.data._M_elems._24_5_ = SUB85(uVar10,0);
  local_1a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_1a8.exp = (this->_solver).dualDegenSum.m_backend.exp;
  local_1a8.neg = (this->_solver).dualDegenSum.m_backend.neg;
  local_1a8.fpclass = (this->_solver).dualDegenSum.m_backend.fpclass;
  local_1a8.prec_elem = (this->_solver).dualDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(pSVar9->sumDualDegen).m_backend,&local_1a8);
  uVar10 = *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 8);
  local_1a8.data._M_elems._32_5_ = SUB85(uVar10,0);
  local_1a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_1a8.data._M_elems._0_8_ =
       *(undefined8 *)(this->_solver).primalDegenSum.m_backend.data._M_elems;
  local_1a8.data._M_elems._8_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 2);
  local_1a8.data._M_elems._16_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 4);
  uVar10 = *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 6);
  local_1a8.data._M_elems._24_5_ = SUB85(uVar10,0);
  local_1a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_1a8.exp = (this->_solver).primalDegenSum.m_backend.exp;
  local_1a8.neg = (this->_solver).primalDegenSum.m_backend.neg;
  local_1a8.fpclass = (this->_solver).primalDegenSum.m_backend.fpclass;
  local_1a8.prec_elem = (this->_solver).primalDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(this->_statistics->sumPrimalDegen).m_backend,&local_1a8);
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}